

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O0

void __thiscall
xmrig::MinerPrivate::getHashrate(MinerPrivate *this,Value *reply,Document *doc,int version)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  reference ppIVar4;
  undefined4 extraout_var;
  size_t sVar5;
  int in_ECX;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  double dVar6;
  Value thread;
  size_t i;
  Hashrate *hr;
  IBackend *backend;
  const_iterator __end2;
  const_iterator __begin2;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *__range2;
  double t [3];
  Value threads;
  Value total;
  Value hashrate;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *in_stack_fffffffffffffe18;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffe20;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffe28;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffe30;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffe38;
  Hashrate *in_stack_fffffffffffffe40;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_fffffffffffffe68;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffe70;
  Hashrate *in_stack_fffffffffffffe78;
  Hashrate *in_stack_fffffffffffffe88;
  GenericStringRef<char> local_168;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_158;
  GenericStringRef<char> local_148;
  GenericStringRef<char> local_138;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_128;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_118;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_108;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_f8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_e8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_d8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_c8;
  ulong local_b8;
  Hashrate *local_a0;
  IBackend *local_98;
  IBackend **local_90;
  __normal_iterator<xmrig::IBackend_*const_*,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
  local_88;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_80;
  double local_78;
  double local_70;
  double local_68;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_58;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_48;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_38;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_28;
  int local_1c;
  
  local_1c = in_ECX;
  local_28 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_stack_fffffffffffffe20,(Type)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_stack_fffffffffffffe20,(Type)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_stack_fffffffffffffe20,(Type)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  memset(&local_78,0,0x18);
  local_80 = in_RDI + 0x12;
  local_88._M_current =
       (IBackend **)
       std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::begin
                 (in_stack_fffffffffffffe18);
  local_90 = (IBackend **)
             std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::end
                       (in_stack_fffffffffffffe18);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<xmrig::IBackend_*const_*,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                             *)in_stack_fffffffffffffe20,
                            (__normal_iterator<xmrig::IBackend_*const_*,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                             *)in_stack_fffffffffffffe18), bVar2) {
    ppIVar4 = __gnu_cxx::
              __normal_iterator<xmrig::IBackend_*const_*,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
              ::operator*(&local_88);
    local_98 = *ppIVar4;
    iVar3 = (*local_98->_vptr_IBackend[4])();
    in_stack_fffffffffffffe78 = (Hashrate *)CONCAT44(extraout_var,iVar3);
    local_a0 = in_stack_fffffffffffffe78;
    if (in_stack_fffffffffffffe78 != (Hashrate *)0x0) {
      in_stack_fffffffffffffe70 =
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)Hashrate::calc(in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38);
      local_78 = local_78 + (double)in_stack_fffffffffffffe70;
      in_stack_fffffffffffffe68 =
           (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
           Hashrate::calc(in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38);
      local_70 = local_70 + (double)in_stack_fffffffffffffe68;
      dVar6 = Hashrate::calc(in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38);
      local_68 = dVar6 + local_68;
      if (local_1c < 2) {
        for (local_b8 = 0; uVar1 = local_b8, sVar5 = Hashrate::threads(local_a0), uVar1 < sVar5;
            local_b8 = local_b8 + 1) {
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GenericValue(in_stack_fffffffffffffe20,(Type)((ulong)in_stack_fffffffffffffe18 >> 0x20))
          ;
          Hashrate::calc(in_stack_fffffffffffffe88,(size_t)in_RDI,(size_t)in_stack_fffffffffffffe78)
          ;
          Hashrate::normalize((double)in_stack_fffffffffffffe28);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(in_stack_fffffffffffffe20,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)in_stack_fffffffffffffe18,
                     (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x231746);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::~GenericValue(&local_d8);
          in_stack_fffffffffffffe40 =
               (Hashrate *)
               Hashrate::calc(in_stack_fffffffffffffe88,(size_t)in_RDI,
                              (size_t)in_stack_fffffffffffffe78);
          Hashrate::normalize((double)in_stack_fffffffffffffe28);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(in_stack_fffffffffffffe20,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)in_stack_fffffffffffffe18,
                     (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x2317a9);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::~GenericValue(&local_e8);
          in_stack_fffffffffffffe38 =
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)Hashrate::calc(in_stack_fffffffffffffe88,(size_t)in_RDI,
                                 (size_t)in_stack_fffffffffffffe78);
          Hashrate::normalize((double)in_stack_fffffffffffffe28);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(in_stack_fffffffffffffe20,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)in_stack_fffffffffffffe18,
                     (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x23180c);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::~GenericValue(&local_f8);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::~GenericValue(&local_c8);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<xmrig::IBackend_*const_*,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
    ::operator++(&local_88);
  }
  Hashrate::normalize((double)in_stack_fffffffffffffe28);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack(in_stack_fffffffffffffe20,
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)in_stack_fffffffffffffe18,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x231938);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_108);
  Hashrate::normalize((double)in_stack_fffffffffffffe28);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack(in_stack_fffffffffffffe20,
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)in_stack_fffffffffffffe18,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x23197c);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_118);
  Hashrate::normalize((double)in_stack_fffffffffffffe28);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack(in_stack_fffffffffffffe20,
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)in_stack_fffffffffffffe18,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x2319c0);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_128);
  rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_138,(char (*) [6])0x27ef0e);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_RDI,(StringRefType *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
            in_stack_fffffffffffffe68);
  rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_148,(char (*) [8])"highest");
  Hashrate::normalize((double)in_stack_fffffffffffffe28);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_RDI,(StringRefType *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
            in_stack_fffffffffffffe68);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_158);
  if (local_1c == 1) {
    rapidjson::GenericStringRef<char>::GenericStringRef<8u>(&local_168,(char (*) [8])"threads");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(in_RDI,(StringRefType *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
              in_stack_fffffffffffffe68);
  }
  rapidjson::GenericStringRef<char>::GenericStringRef<9u>
            ((GenericStringRef<char> *)&stack0xfffffffffffffe88,(char (*) [9])"hashrate");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_RDI,(StringRefType *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
            in_stack_fffffffffffffe68);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_58);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_48);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_38);
  return;
}

Assistant:

void getHashrate(rapidjson::Value &reply, rapidjson::Document &doc, int version) const
    {
        using namespace rapidjson;
        auto &allocator = doc.GetAllocator();

        Value hashrate(kObjectType);
        Value total(kArrayType);
        Value threads(kArrayType);

        double t[3] = { 0.0 };

        for (IBackend *backend : backends) {
            const Hashrate *hr = backend->hashrate();
            if (!hr) {
                continue;
            }

            t[0] += hr->calc(Hashrate::ShortInterval);
            t[1] += hr->calc(Hashrate::MediumInterval);
            t[2] += hr->calc(Hashrate::LargeInterval);

            if (version > 1) {
                continue;
            }

            for (size_t i = 0; i < hr->threads(); i++) {
                Value thread(kArrayType);
                thread.PushBack(Hashrate::normalize(hr->calc(i, Hashrate::ShortInterval)),  allocator);
                thread.PushBack(Hashrate::normalize(hr->calc(i, Hashrate::MediumInterval)), allocator);
                thread.PushBack(Hashrate::normalize(hr->calc(i, Hashrate::LargeInterval)),  allocator);

                threads.PushBack(thread, allocator);
            }
        }

        total.PushBack(Hashrate::normalize(t[0]),  allocator);
        total.PushBack(Hashrate::normalize(t[1]), allocator);
        total.PushBack(Hashrate::normalize(t[2]),  allocator);

        hashrate.AddMember("total",   total, allocator);
        hashrate.AddMember("highest", Hashrate::normalize(maxHashrate), allocator);

        if (version == 1) {
            hashrate.AddMember("threads", threads, allocator);
        }

        reply.AddMember("hashrate", hashrate, allocator);
    }